

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationfastlatinbuilder.cpp
# Opt level: O0

int32_t icu_63::anon_unknown_9::compareInt64AsUnsigned(int64_t a,int64_t b)

{
  int64_t b_local;
  int64_t a_local;
  
  if ((ulong)a < (ulong)b) {
    a_local._4_4_ = -1;
  }
  else if ((ulong)b < (ulong)a) {
    a_local._4_4_ = 1;
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int32_t
compareInt64AsUnsigned(int64_t a, int64_t b) {
    if((uint64_t)a < (uint64_t)b) {
        return -1;
    } else if((uint64_t)a > (uint64_t)b) {
        return 1;
    } else {
        return 0;
    }
}